

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O1

int run_test_loop_handles(void)

{
  int iVar1;
  uv_timer_t *puVar2;
  undefined8 uVar3;
  long lVar4;
  uv_prepare_t *puVar5;
  uv_check_t *puVar6;
  
  puVar2 = (uv_timer_t *)uv_default_loop();
  iVar1 = uv_prepare_init(puVar2,&prepare_1_handle);
  if (iVar1 == 0) {
    puVar5 = &prepare_1_handle;
    iVar1 = uv_prepare_start(&prepare_1_handle,prepare_1_cb);
    puVar2 = (uv_timer_t *)puVar5;
    if (iVar1 != 0) goto LAB_00163d3c;
    puVar2 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_check_init(puVar2,&check_handle);
    if (iVar1 != 0) goto LAB_00163d41;
    puVar6 = &check_handle;
    iVar1 = uv_check_start(&check_handle,check_cb);
    puVar2 = (uv_timer_t *)puVar6;
    if (iVar1 != 0) goto LAB_00163d46;
    puVar2 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_prepare_init(puVar2,&prepare_2_handle);
    if (iVar1 != 0) goto LAB_00163d4b;
    lVar4 = 0;
    do {
      puVar2 = (uv_timer_t *)uv_default_loop();
      iVar1 = uv_idle_init(puVar2,(long)idle_1_handles[0].handle_queue + lVar4 + -0x20);
      if (iVar1 != 0) {
        run_test_loop_handles_cold_6();
        goto LAB_00163d37;
      }
      lVar4 = lVar4 + 0x78;
    } while (lVar4 != 0x348);
    puVar2 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer_handle);
    if (iVar1 != 0) goto LAB_00163d50;
    puVar2 = &timer_handle;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,100,100);
    if (iVar1 != 0) goto LAB_00163d55;
    uv_unref(&timer_handle);
    puVar2 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_run(puVar2,0);
    if (iVar1 != 0) goto LAB_00163d5a;
    if (loop_iteration != 0x15) goto LAB_00163d5f;
    if (prepare_1_cb_called != 0x15) goto LAB_00163d64;
    if (prepare_1_close_cb_called != 1) goto LAB_00163d69;
    if (prepare_2_cb_called != 10) goto LAB_00163d6e;
    if (prepare_2_close_cb_called != 1) goto LAB_00163d73;
    if (check_cb_called != 0x15) goto LAB_00163d78;
    if (check_close_cb_called != 1) goto LAB_00163d7d;
    if (idle_1_close_cb_called != 7) goto LAB_00163d82;
    if (idle_2_close_cb_called != idle_2_cb_started) goto LAB_00163d87;
    if (idle_2_is_active != '\x01') {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      puVar2 = (uv_timer_t *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00163d91;
    }
  }
  else {
LAB_00163d37:
    run_test_loop_handles_cold_1();
LAB_00163d3c:
    run_test_loop_handles_cold_2();
LAB_00163d41:
    run_test_loop_handles_cold_3();
LAB_00163d46:
    run_test_loop_handles_cold_4();
LAB_00163d4b:
    run_test_loop_handles_cold_5();
LAB_00163d50:
    run_test_loop_handles_cold_7();
LAB_00163d55:
    run_test_loop_handles_cold_8();
LAB_00163d5a:
    run_test_loop_handles_cold_9();
LAB_00163d5f:
    run_test_loop_handles_cold_10();
LAB_00163d64:
    run_test_loop_handles_cold_11();
LAB_00163d69:
    run_test_loop_handles_cold_12();
LAB_00163d6e:
    run_test_loop_handles_cold_13();
LAB_00163d73:
    run_test_loop_handles_cold_14();
LAB_00163d78:
    run_test_loop_handles_cold_15();
LAB_00163d7d:
    run_test_loop_handles_cold_16();
LAB_00163d82:
    run_test_loop_handles_cold_17();
LAB_00163d87:
    run_test_loop_handles_cold_18();
  }
  run_test_loop_handles_cold_20();
LAB_00163d91:
  run_test_loop_handles_cold_19();
  if (puVar2 == &timer_handle) {
    return 0x30e5a8;
  }
  timer_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar2,0);
  return iVar1;
}

Assistant:

TEST_IMPL(loop_handles) {
  int i;
  int r;

  r = uv_prepare_init(uv_default_loop(), &prepare_1_handle);
  ASSERT(r == 0);
  r = uv_prepare_start(&prepare_1_handle, prepare_1_cb);
  ASSERT(r == 0);

  r = uv_check_init(uv_default_loop(), &check_handle);
  ASSERT(r == 0);
  r = uv_check_start(&check_handle, check_cb);
  ASSERT(r == 0);

  /* initialize only, prepare_2 is started by prepare_1_cb */
  r = uv_prepare_init(uv_default_loop(), &prepare_2_handle);
  ASSERT(r == 0);

  for (i = 0; i < IDLE_COUNT; i++) {
    /* initialize only, idle_1 handles are started by check_cb */
    r = uv_idle_init(uv_default_loop(), &idle_1_handles[i]);
    ASSERT(r == 0);
  }

  /* don't init or start idle_2, both is done by idle_1_cb */

  /* The timer callback is there to keep the event loop polling unref it as it
   * is not supposed to keep the loop alive */
  r = uv_timer_init(uv_default_loop(), &timer_handle);
  ASSERT(r == 0);
  r = uv_timer_start(&timer_handle, timer_cb, TIMEOUT, TIMEOUT);
  ASSERT(r == 0);
  uv_unref((uv_handle_t*)&timer_handle);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(loop_iteration == ITERATIONS);

  ASSERT(prepare_1_cb_called == ITERATIONS);
  ASSERT(prepare_1_close_cb_called == 1);

  ASSERT(prepare_2_cb_called == ITERATIONS / 2);
  ASSERT(prepare_2_close_cb_called == 1);

  ASSERT(check_cb_called == ITERATIONS);
  ASSERT(check_close_cb_called == 1);

  /* idle_1_cb should be called a lot */
  ASSERT(idle_1_close_cb_called == IDLE_COUNT);

  ASSERT(idle_2_close_cb_called == idle_2_cb_started);
  ASSERT(idle_2_is_active == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}